

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O0

Header * __thiscall minibag::Bag::readMessageDataHeader(Bag *this,IndexEntry *index_entry)

{
  ostream *this_00;
  BagFormatException *this_01;
  long in_RSI;
  Header *in_RDI;
  Header *in_stack_00000020;
  uint64_t in_stack_00000028;
  Bag *in_stack_00000030;
  stringstream ss;
  uint32_t bytes_read;
  uint32_t data_size;
  Header *header;
  string *in_stack_fffffffffffffde8;
  stringstream local_1c0 [16];
  ostream local_1b0 [8];
  uint32_t *in_stack_fffffffffffffe58;
  Bag *in_stack_fffffffffffffe60;
  Header *in_stack_fffffffffffffe68;
  uint32_t in_stack_fffffffffffffe74;
  Buffer *in_stack_fffffffffffffe78;
  Bag *in_stack_fffffffffffffe80;
  
  miniros::Header::Header(in_RDI);
  if (*(int *)(in_RSI + 0x80) == 0x66) {
    readMessageDataRecord102(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    if (*(int *)(in_RSI + 0x80) != 200) {
      std::__cxx11::stringstream::stringstream(local_1c0);
      this_00 = std::operator<<(local_1b0,"Unhandled version: ");
      std::ostream::operator<<(this_00,*(int *)(in_RSI + 0x80));
      this_01 = (BagFormatException *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      BagFormatException::BagFormatException(this_01,in_stack_fffffffffffffde8);
      __cxa_throw(this_01,&BagFormatException::typeinfo,BagFormatException::~BagFormatException);
    }
    decompressChunk(in_stack_fffffffffffffe60,(uint64_t)in_stack_fffffffffffffe58);
    readMessageDataHeaderFromBuffer
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
               in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->mode_,in_stack_fffffffffffffe58
              );
  }
  return in_RDI;
}

Assistant:

miniros::Header Bag::readMessageDataHeader(IndexEntry const& index_entry) {
    miniros::Header header;
    uint32_t data_size;
    uint32_t bytes_read;
    switch (version_)
    {
    case 200:
        decompressChunk(index_entry.chunk_pos);
        readMessageDataHeaderFromBuffer(*current_buffer_, index_entry.offset, header, data_size, bytes_read);
        return header;
    case 102:
        readMessageDataRecord102(index_entry.chunk_pos, header);
        return header;
    default:
        {
            std::stringstream ss;
            ss << "Unhandled version: " << version_;
            throw BagFormatException(ss.str());
        }
    }
}